

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorPool::TryFindFileInFallbackDatabase
          (DescriptorPool *this,string_view name,DeferredValidation *deferred_validation)

{
  string_view filename;
  bool bVar1;
  pointer pTVar2;
  FileDescriptor *pFVar3;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
  local_68;
  DescriptorPool *local_50;
  size_t local_48;
  FileDescriptorProto *local_40;
  FileDescriptorProto *file_proto;
  DeferredValidation *pDStack_30;
  anon_class_1_0_00000001 find_file;
  DeferredValidation *deferred_validation_local;
  DescriptorPool *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (DescriptorPool *)name._M_len;
  if (this->fallback_database_ == (DescriptorDatabase *)0x0) {
    name_local._M_str._7_1_ = false;
  }
  else {
    pDStack_30 = deferred_validation;
    pTVar2 = std::
             unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
             ::operator->(&this->tables_);
    bVar1 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
            ::contains<std::basic_string_view<char,std::char_traits<char>>>
                      ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                        *)&pTVar2->known_bad_files_,
                       (key_arg<std::basic_string_view<char>_> *)&this_local);
    if (bVar1) {
      name_local._M_str._7_1_ = false;
    }
    else {
      local_40 = DeferredValidation::CreateProto(pDStack_30);
      local_50 = this_local;
      local_48 = name_local._M_len;
      filename._M_str = (char *)name_local._M_len;
      filename._M_len = (size_t)this_local;
      bVar1 = TryFindFileInFallbackDatabase::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)((long)&file_proto + 7),this->fallback_database_
                         ,filename,local_40);
      if ((bVar1) &&
         (pFVar3 = BuildFileFromDatabase(this,local_40,pDStack_30), pFVar3 != (FileDescriptor *)0x0)
         ) {
        name_local._M_str._7_1_ = true;
      }
      else {
        pTVar2 = std::
                 unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                 ::operator->(&this->tables_);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::emplace<std::basic_string_view<char,_std::char_traits<char>_>_&,_0>
                  (&local_68,
                   &(pTVar2->known_bad_files_).
                    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ,(basic_string_view<char,_std::char_traits<char>_> *)&this_local);
        name_local._M_str._7_1_ = false;
      }
    }
  }
  return name_local._M_str._7_1_;
}

Assistant:

bool DescriptorPool::TryFindFileInFallbackDatabase(
    absl::string_view name, DeferredValidation& deferred_validation) const {
  if (fallback_database_ == nullptr) return false;

  if (tables_->known_bad_files_.contains(name)) return false;

  // NOINLINE to reduce the stack cost of the operation in the caller.
  const auto find_file = [](DescriptorDatabase& database,
                            absl::string_view filename,
                            FileDescriptorProto& output) PROTOBUF_NOINLINE {
    return database.FindFileByName(std::string(filename), &output);
  };

  auto& file_proto = deferred_validation.CreateProto();
  if (!find_file(*fallback_database_, name, file_proto) ||
      BuildFileFromDatabase(file_proto, deferred_validation) == nullptr) {
    tables_->known_bad_files_.emplace(name);
    return false;
  }
  return true;
}